

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util_test.cc
# Opt level: O3

void __thiscall
FileTest_Serialize_and_Deserialize_string_Test::~FileTest_Serialize_and_Deserialize_string_Test
          (FileTest_Serialize_and_Deserialize_string_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(FileTest, Serialize_and_Deserialize_string) {
#ifndef _MSC_VER
  std::string filename = "/tmp/test.bin";
#else
  std::string filename = "../../test.bin";
#endif
  FILE* file = OpenFileOrDie(filename.c_str(), "w");
  // Serialize
  std::string str_1("apple");
  std::string str_2("love");
  WriteStringToFile(file, str_1);
  WriteStringToFile(file, str_2);
  Close(file);
  str_1.clear();
  str_2.clear();
  // Deserialize
  file = OpenFileOrDie(filename.c_str(), "r");
  ReadStringFromFile(file, str_1);
  ReadStringFromFile(file, str_2);
  EXPECT_EQ(str_1, "apple");
  EXPECT_EQ(str_2, "love");
  Close(file);
  RemoveFile(filename.c_str());
}